

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O1

int ffbinse(char *binspec,int *imagetype,int *histaxis,char (*colname) [71],double *minin,
           double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
           char (*binname) [71],double *wt,char *wtname,int *recip,char ***exprs,int *status)

{
  byte *pbVar1;
  char (*pacVar2) [71];
  int iVar3;
  size_t sVar4;
  char **ppcVar5;
  int iVar6;
  byte *__s;
  byte bVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  char **ppcVar12;
  byte *local_128;
  char *file_expr;
  char *local_118;
  char *local_110;
  char (*local_108) [71];
  int *local_100;
  char (*local_f8) [71];
  undefined4 local_ec;
  int *local_e8;
  char **local_e0;
  char *exprend [5];
  char *exprbeg [5];
  double dummy;
  char tmpname [71];
  
  file_expr = (char *)0x0;
  exprbeg[4] = (char *)0x0;
  exprbeg[2] = (char *)0x0;
  exprbeg[3] = (char *)0x0;
  exprbeg[0] = (char *)0x0;
  exprbeg[1] = (char *)0x0;
  exprend[4] = (char *)0x0;
  exprend[2] = (char *)0x0;
  exprend[3] = (char *)0x0;
  exprend[0] = (char *)0x0;
  exprend[1] = (char *)0x0;
  if (exprs != (char ***)0x0) {
    *exprs = (char **)0x0;
  }
  if (0 < *status) {
    return *status;
  }
  *histaxis = 2;
  *imagetype = 0x1f;
  *wt = 1.0;
  *recip = 0;
  *wtname = '\0';
  lVar11 = 0;
  lVar10 = 0;
  do {
    (*colname)[lVar11] = '\0';
    (*minname)[lVar11] = '\0';
    (*maxname)[lVar11] = '\0';
    (*binname)[lVar11] = '\0';
    *(undefined8 *)((long)minin + lVar10) = 0xb8a83e285ebab4b7;
    *(undefined8 *)((long)maxin + lVar10) = 0xb8a83e285ebab4b7;
    *(undefined8 *)((long)binsizein + lVar10) = 0xb8a83e285ebab4b7;
    lVar10 = lVar10 + 8;
    lVar11 = lVar11 + 0x47;
  } while (lVar11 != 0x11c);
  local_128 = (byte *)(binspec + 3);
  local_ec = (undefined4)CONCAT71((int7)((ulong)lVar10 >> 8),1);
  switch(binspec[3]) {
  case 'b':
    *imagetype = 0xb;
    break;
  case 'c':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
    goto switchD_001803db_caseD_63;
  case 'd':
    *imagetype = 0x52;
    break;
  case 'i':
    *imagetype = 0x15;
    break;
  case 'j':
    break;
  default:
    if (binspec[3] == 'r') {
      *imagetype = 0x2a;
      break;
    }
    goto switchD_001803db_caseD_63;
  }
  local_128 = (byte *)(binspec + 4);
  local_ec = 0;
switchD_001803db_caseD_63:
  if (*local_128 == 0) {
LAB_0018045f:
    return *status;
  }
  pbVar1 = local_128;
  local_118 = binspec;
  if (*local_128 != 0x20) {
    ffpmsg("binning specification syntax error:");
    ffpmsg(local_118);
LAB_00180479:
    *status = 0x7d;
    return 0x7d;
  }
  do {
    local_128 = pbVar1;
    bVar7 = *local_128;
    pbVar1 = local_128 + 1;
  } while (bVar7 == 0x20);
  if (bVar7 == 0) goto LAB_0018045f;
  local_100 = histaxis;
  local_e8 = imagetype;
  if (bVar7 == 0x40) {
    iVar3 = ffimport_file((char *)(local_128 + 1),&file_expr,status);
    pbVar1 = (byte *)file_expr;
    if (iVar3 != 0) goto LAB_0018045f;
    do {
      local_128 = pbVar1;
      pbVar1 = local_128 + 1;
    } while (*local_128 == 0x20);
  }
  if (*local_128 == 0x28) {
    local_110 = (char *)0x0;
LAB_001804c9:
    do {
      __s = local_128 + 1;
      pbVar1 = local_128 + 1;
      local_128 = __s;
    } while (*pbVar1 == 0x20);
    sVar4 = strcspn((char *)__s," ,)");
    local_108 = (char (*) [71])(long)(int)sVar4;
    strncat(colname[(long)local_110],(char *)__s,(size_t)local_108);
    for (local_128 = __s + (long)local_108; *local_128 == 0x20; local_128 = local_128 + 1) {
    }
    if (*local_128 != 0x29) goto code_r0x0018051e;
    *local_100 = (int)local_110 + 1;
    if (local_110 != (char *)0x4) {
      pbVar1 = local_128 + 1;
      do {
        local_128 = pbVar1;
        bVar7 = *local_128;
        pbVar1 = local_128 + 1;
      } while (bVar7 == 0x20);
      if (bVar7 == 0) {
LAB_00180754:
        if (file_expr != (char *)0x0) {
          free(file_expr);
        }
        goto LAB_0018045f;
      }
      if (bVar7 != 0x3d) {
        ffpmsg("illegal binning specification in URL:");
        pcVar8 = " an equals sign \'=\' must follow the column names";
LAB_0018077f:
        ffpmsg(pcVar8);
        ffpmsg(local_118);
        if (file_expr != (char *)0x0) {
          free(file_expr);
        }
        goto LAB_00180479;
      }
      do {
        local_128 = pbVar1;
        pbVar1 = local_128 + 1;
      } while (*local_128 == 0x20);
      ffbinre((char **)&local_128,tmpname,(char **)0x0,(char **)0x0,minin,maxin,binsizein,*minname,
              *maxname,*binname,status);
      if (0 < *status) {
        ffpmsg("illegal binning specification in URL:");
        ffpmsg(local_118);
        goto LAB_00180754;
      }
      pbVar1 = local_128;
      if (1 < *local_100) {
        local_108 = binname + 1;
        lVar10 = 1;
        pacVar2 = maxname;
        local_110 = *minname;
        do {
          local_110 = local_110 + 0x47;
          minin[lVar10] = *minin;
          maxin[lVar10] = *maxin;
          binsizein[lVar10] = *binsizein;
          strcpy(local_110,*minname);
          local_f8 = pacVar2 + 1;
          strcpy(pacVar2[1],*maxname);
          pacVar2 = local_108;
          strcpy(*local_108,*binname);
          lVar10 = lVar10 + 1;
          local_108 = pacVar2 + 1;
          pacVar2 = local_f8;
          pbVar1 = local_128;
        } while (lVar10 < *local_100);
      }
      do {
        local_128 = pbVar1;
        bVar7 = *local_128;
        pbVar1 = local_128 + 1;
      } while (bVar7 == 0x20);
      if (bVar7 == 0) goto LAB_0018045f;
      if (bVar7 != 0x3b) {
        pcVar8 = "illegal syntax after binning range specification in URL:";
        goto LAB_0018077f;
      }
      iVar3 = 0;
      goto LAB_0018080d;
    }
    goto LAB_00180693;
  }
  lVar10 = 0;
  iVar3 = 0;
  do {
    local_110 = (char *)CONCAT44(local_110._4_4_,iVar3);
    exprend[lVar10] = (char *)0x0;
    local_e0 = exprbeg + lVar10;
    *local_e0 = (char *)0x0;
    local_108 = (char (*) [71])(binsizein + lVar10);
    local_f8 = minname + lVar10;
    ffbinre((char **)&local_128,colname[lVar10],local_e0,exprend + lVar10,minin + lVar10,
            maxin + lVar10,(double *)local_108,*local_f8,maxname[lVar10],binname[lVar10],status);
    iVar3 = (int)local_110;
    if (*local_e0 != (char *)0x0) {
      iVar3 = 1;
    }
    if (0 < *status) {
      pcVar8 = "illegal syntax in binning range specification in URL:";
      goto LAB_001808be;
    }
    bVar7 = *local_128;
    if (bVar7 < 0x2c) {
      pbVar1 = local_128;
      if (bVar7 != 0x20) {
        if (bVar7 == 0) goto LAB_001807bb;
LAB_00180a5c:
        pcVar8 = "illegal characters following binning specification in URL:";
        goto LAB_0018069a;
      }
      do {
        local_128 = pbVar1;
        bVar7 = *local_128;
        pbVar1 = local_128 + 1;
      } while (bVar7 == 0x20);
      if ((bVar7 == 0) || ((bVar7 != 0x2c && (pbVar1 = local_128, bVar7 == 0x3b))))
      goto LAB_001807bb;
    }
    else {
      if (bVar7 != 0x2c) {
        if (bVar7 != 0x3b) goto LAB_00180a5c;
        goto LAB_001807bb;
      }
      pbVar1 = local_128 + 1;
    }
    local_128 = pbVar1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  lVar10 = 4;
LAB_001807bb:
  iVar6 = (int)lVar10;
  if (iVar6 == 4) {
    ffpmsg("illegal binning specification in URL:");
    ffpmsg("apparently greater than 4 histogram dimensions");
    ffpmsg(local_118);
LAB_001807e2:
    *status = 0x7d;
    return 0x7d;
  }
  *local_100 = iVar6 + 1;
  if (((((iVar6 == 0) && ((*colname)[0] == '\0')) && (*minin == -9.1191291391491e-36)) &&
      ((!NAN(*minin) && (*maxin == -9.1191291391491e-36)))) && (!NAN(*maxin))) {
    *local_100 = 2;
    binsizein[1] = *binsizein;
  }
LAB_0018080d:
  pbVar1 = local_128;
  if (*local_128 == 0x3b) {
    pbVar1 = local_128 + 1;
    do {
      local_128 = pbVar1;
      pbVar1 = local_128 + 1;
    } while (*local_128 == 0x20);
    *recip = 0;
    if (*local_128 == 0x2f) {
      *recip = 1;
      do {
        local_128 = pbVar1;
        pbVar1 = local_128 + 1;
      } while (*local_128 == 0x20);
    }
    exprend[4] = (char *)0x0;
    exprbeg[4] = (char *)0x0;
    ffbinre((char **)&local_128,wtname,exprbeg + 4,exprend + 4,&dummy,&dummy,wt,tmpname,tmpname,
            tmpname,status);
    iVar6 = 1;
    if (exprbeg[4] == (char *)0x0) {
      iVar6 = iVar3;
    }
    if (0 < *status) {
      pcVar8 = "illegal binning weight specification in URL:";
LAB_001808be:
      ffpmsg(pcVar8);
      ffpmsg(local_118);
      if (file_expr != (char *)0x0) {
        free(file_expr);
      }
      goto LAB_00180a3b;
    }
    bVar7 = (byte)local_ec;
    iVar3 = iVar6;
    if (bVar7 == 0) {
LAB_00180bc1:
      pbVar1 = local_128;
      if ((bVar7 & exprbeg[4] != (char *)0x0) != 1) goto LAB_001808eb;
    }
    else if ((*wt == 1.0) && (!NAN(*wt))) {
      if (bVar7 == 0) goto LAB_00180bc1;
      pbVar1 = local_128;
      if (exprbeg[4] == (char *)0x0 && *wtname == '\0') goto LAB_001808eb;
    }
    *local_e8 = 0x2a;
    pbVar1 = local_128;
  }
LAB_001808eb:
  do {
    local_128 = pbVar1;
    pbVar1 = local_128 + 1;
  } while (*local_128 == 0x20);
  if (*local_128 != 0) {
    ffpmsg("illegal syntax after binning weight specification in URL:");
    ffpmsg(local_118);
    *status = 0x7d;
  }
  if (file_expr != (char *)0x0) {
    free(file_expr);
  }
  if (iVar3 != 0) {
    lVar10 = 0;
    pcVar8 = (char *)0x0;
    do {
      pcVar9 = pcVar8;
      ppcVar5 = exprend + lVar10;
      ppcVar12 = exprbeg + lVar10;
      lVar10 = lVar10 + 1;
      pcVar8 = *ppcVar5 + (long)(pcVar9 + (1 - (long)*ppcVar12));
    } while (lVar10 != 5);
    ppcVar5 = (char **)malloc((size_t)(*ppcVar5 + (long)(pcVar9 + (0x29 - (long)*ppcVar12))));
    if (ppcVar5 == (char **)0x0) {
      ffpmsg("ffbinse: memory allocation failure");
      *status = 0x71;
    }
    else {
      *exprs = ppcVar5;
      ppcVar12 = ppcVar5 + 5;
      lVar10 = 0;
      do {
        (*exprs)[lVar10] = (char *)ppcVar12;
        sVar4 = (long)exprend[lVar10] - (long)exprbeg[lVar10];
        strncpy((char *)ppcVar12,exprbeg[lVar10],sVar4);
        pcVar8 = (char *)((long)ppcVar12 + sVar4);
        ppcVar12 = (char **)(pcVar8 + 1);
        *pcVar8 = '\0';
        lVar10 = lVar10 + 1;
      } while (lVar10 != 5);
    }
    if (ppcVar5 == (char **)0x0) {
      return 0x71;
    }
  }
LAB_00180a3b:
  return *status;
code_r0x0018051e:
  local_110 = local_110 + 1;
  if (local_110 == (char *)0x4) goto LAB_00180693;
  goto LAB_001804c9;
LAB_00180693:
  pcVar8 = "binning specification has too many column names or is missing closing \')\':";
LAB_0018069a:
  ffpmsg(pcVar8);
  ffpmsg(local_118);
  if (file_expr != (char *)0x0) {
    free(file_expr);
  }
  goto LAB_001807e2;
}

Assistant:

int ffbinse(char *binspec,   /* I - binning specification */
                   int *imagetype,      /* O - image type, TINT or TSHORT */
                   int *histaxis,       /* O - no. of axes in the histogram */
                   char colname[4][FLEN_VALUE],  /* column name for axis */
                   double *minin,        /* minimum value for each axis */
                   double *maxin,        /* maximum value for each axis */
                   double *binsizein,    /* size of bins on each axis */
                   char minname[4][FLEN_VALUE],  /* keyword name for min */
                   char maxname[4][FLEN_VALUE],  /* keyword name for max */
                   char binname[4][FLEN_VALUE],  /* keyword name for binsize */
                   double *wt,          /* weighting factor          */
                   char *wtname,        /* keyword or column name for weight */
                   int *recip,          /* the reciprocal of the weight? */
	           char ***exprs,       /* returned with expressions (or 0) */
                   int *status)
{
/*
   Parse the extended input binning specification string, returning
   the binning parameters.  Supports up to 4 dimensions.  The binspec
   string has one of these forms:

   bin binsize                  - 2D histogram with binsize on each axis
   bin xcol                     - 1D histogram on column xcol
   bin (xcol, ycol) = binsize   - 2D histogram with binsize on each axis
   bin x=min:max:size, y=min:max:size, z..., t... 
   bin x=:max, y=::size
   bin x=size, y=min::size
   bin x(expr), y(expr)=min:max:size, ...

   most other reasonable combinations are supported. The (expr) is an 
   optional expression that will be calculated on the fly instead of
   a table column name.  The name is still used for the output pixel
   array metadata.

   If expr == 0, then expressions are forbidden.  The caller does not
   expect expressions.  

   If exprs is non-zero, then upon return an array of expressions is
   passed back to the caller.  Storage may be allocated by this routine,
   If *exprs is non-zero upon return, the caller is responsible to
   free(*exprs).  Upon return, the contains of exprs is,
       (*exprs)[0] = expression for column 1 (or 0 if none)
       (*exprs)[1] = expression for column 2 (or 0 if none)
       (*exprs)[2] = expression for column 3 (or 0 if none)
       (*exprs)[3] = expression for column 4 (or 0 if none)
       (*exprs)[4] = expression for weighting (or 0 if none)

   If the user specifies a column name and not an expression for bin
   axis i, then the corresponding (*exprs)[i] will be a null pointer.

   To be recognized as an expression, the weighting expression must be
   enclosed in parentheses.

   Expressions are never allowed using the bin (xcol,ycol) notation.

*/
    int ii, slen, defaulttype;
    char *ptr, tmpname[FLEN_VALUE], *file_expr = NULL;
    double  dummy;
    char *exprbeg[5] = {0}, *exprend[5] = {0};
    int has_exprs = 0;

    if (exprs) (*exprs) = 0; /* initialized output */

    if (*status > 0)
         return(*status);

    /* set the default values */
    *histaxis = 2;
    *imagetype = TINT;
    defaulttype = 1;
    *wt = 1.;
    *recip = 0;
    *wtname = '\0';

    /* set default values */
    for (ii = 0; ii < 4; ii++)
    {
        *colname[ii] = '\0';
        *minname[ii] = '\0';
        *maxname[ii] = '\0';
        *binname[ii] = '\0';
        minin[ii] = DOUBLENULLVALUE;  /* undefined values */
        maxin[ii] = DOUBLENULLVALUE;
        binsizein[ii] = DOUBLENULLVALUE;
    }

    ptr = binspec + 3;  /* skip over 'bin' */

    if (*ptr == 'i' )  /* bini */
    {
        *imagetype = TSHORT;
        defaulttype = 0;
        ptr++;
    }
    else if (*ptr == 'j' )  /* binj; same as default */
    {
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'r' )  /* binr */
    {
        *imagetype = TFLOAT;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'd' )  /* bind */
    {
        *imagetype = TDOUBLE;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'b' )  /* binb */
    {
        *imagetype = TBYTE;
        defaulttype = 0;
        ptr ++;
    }

    if (*ptr == '\0')  /* use all defaults for other parameters */
        return(*status);
    else if (*ptr != ' ')  /* must be at least one blank */
    {
        ffpmsg("binning specification syntax error:");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }

    while (*ptr == ' ')  /* skip over blanks */
           ptr++;

    if (*ptr == '\0')   /* no other parameters; use defaults */
        return(*status);

    /* Check if need to import expression from a file */

    if( *ptr=='@' ) {
       if( ffimport_file( ptr+1, &file_expr, status ) ) return(*status);
       ptr = file_expr;
       while (*ptr == ' ')
               ptr++;       /* skip leading white space... again */
    }

    if (*ptr == '(' )
    {
        /* this must be the opening parenthesis around a list of column */
        /* names, optionally followed by a '=' and the binning spec. */

        for (ii = 0; ii < 4; ii++)
        {
            ptr++;               /* skip over the '(', ',', or ' ') */
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            slen = strcspn(ptr, " ,)");
            strncat(colname[ii], ptr, slen); /* copy 1st column name */

            ptr += slen;
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == ')' )   /* end of the list of names */
            {
                *histaxis = ii + 1;
                break;
            }
        }

        if (ii == 4)   /* too many names in the list , or missing ')'  */
        {
            ffpmsg(
 "binning specification has too many column names or is missing closing ')':");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the closing parenthesis */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == '\0') {
	    if( file_expr ) free( file_expr );
            return(*status);  /* parsed the entire string */
	}

        else if (*ptr != '=')  /* must be an equals sign now*/
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(" an equals sign '=' must follow the column names");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the equals sign */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        /* get the single range specification for all the columns */
	/* Note that the extended syntax is not allowed here */
        ffbinr(&ptr, tmpname, minin,
	       maxin, binsizein, minname[0],
	       maxname[0], binname[0], status);
        if (*status > 0)
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        for (ii = 1; ii < *histaxis; ii++)
        {
            minin[ii] = minin[0];
            maxin[ii] = maxin[0];
            binsizein[ii] = binsizein[0];
            strcpy(minname[ii], minname[0]);
            strcpy(maxname[ii], maxname[0]);
            strcpy(binname[ii], binname[0]);
        }

        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == ';')
            goto getweight;   /* a weighting factor is specified */

        if (*ptr != '\0')  /* must have reached end of string */
        {
            ffpmsg("illegal syntax after binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        return(*status);
    }             /* end of case with list of column names in ( )  */

    /* if we've reached this point, then the binning specification */
    /* must be of the form: XCOL = min:max:binsize, YCOL = ...     */
    /* where the column name followed by '=' are optional.         */
    /* If the column name is not specified, then use the default name */

    for (ii = 0; ii < 4; ii++) /* allow up to 4 histogram dimensions */
    {
        exprbeg[ii] = exprend[ii] = 0;
        ffbinre(&ptr, colname[ii], &(exprbeg[ii]), &(exprend[ii]),
		&minin[ii], &maxin[ii], &binsizein[ii], minname[ii],
		maxname[ii], binname[ii], status);
	/* Check for expressions */
	if (exprbeg[ii]) has_exprs = 1;
	
        if (*status > 0)
        {
            ffpmsg("illegal syntax in binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        if (*ptr == '\0' || *ptr == ';')
            break;        /* reached the end of the string */

        if (*ptr == ' ')
        {
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == '\0' || *ptr == ';')
                break;        /* reached the end of the string */

            if (*ptr == ',')
                ptr++;  /* comma separates the next column specification */
        }
        else if (*ptr == ',')
        {          
            ptr++;  /* comma separates the next column specification */
        }
        else
        {
            ffpmsg("illegal characters following binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }
    }

    if (ii == 4)
    {
        /* there are yet more characters in the string */
        ffpmsg("illegal binning specification in URL:");
        ffpmsg("apparently greater than 4 histogram dimensions");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }
    else
        *histaxis = ii + 1;

    /* special case: if a single number was entered it should be      */
    /* interpreted as the binning factor for the default X and Y axes */

    if (*histaxis == 1 && *colname[0] == '\0' && 
         minin[0] == DOUBLENULLVALUE && maxin[0] == DOUBLENULLVALUE)
    {
        *histaxis = 2;
        binsizein[1] = binsizein[0];
    }

getweight:
    if (*ptr == ';')  /* looks like a weighting factor is given */
    {
        ptr++;
       
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        *recip = 0;
        if (*ptr == '/')
        {
            *recip = 1;  /* the reciprocal of the weight is entered */
            ptr++;

            while (*ptr == ' ')  /* skip over blanks */
                ptr++;
        }

        /* parse the weight as though it were a binrange. */
        /* either a column name or a numerical value will be returned */

        exprbeg[4] = exprend[4] = 0;
        ffbinre(&ptr, wtname, &(exprbeg[4]), &(exprend[4]),
		&dummy, &dummy, wt, tmpname,
		tmpname, tmpname, status);
	if (exprbeg[4]) has_exprs = 1;

        if (*status > 0)
        {
            ffpmsg("illegal binning weight specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        /* creat a float datatype histogram by default, if weight */
        /* factor is not = 1.0  */

        if ( (defaulttype && *wt != 1.0) || 
	     (defaulttype && *wtname) ||
	     (defaulttype && exprbeg[4])) {
	  *imagetype = TFLOAT;
	}
    }

    while (*ptr == ' ')  /* skip over blanks */
         ptr++;

    if (*ptr != '\0')  /* should have reached the end of string */
    {
        ffpmsg("illegal syntax after binning weight specification in URL:");
        ffpmsg(binspec);
        *status = URL_PARSE_ERROR;
    }

    if( file_expr ) free( file_expr );

    /* If we found expressions, this is where we accumulate them into 
       something to be returned to the caller.  The start and end of
       each expression will be found in exprbeg[] and exprend[], with
       the 5th entry being the weight expression if any */
    if (has_exprs) {
      size_t nchars = 0;
      char *ptr;
      for (ii = 0; ii <= 4; ii++) {
	nchars += (exprend[ii] - exprbeg[ii]) + 1; /* null terminator */
      }
      /* Allocate storage for 5 pointers plus the characters.  Caller
         is responsible to free(*exprs) which will free both the 5-array
	 and the character string data. */
      ptr = malloc( sizeof(char *) * 5 + nchars * sizeof(char) );
      if (!ptr) {
	ffpmsg("ffbinse: memory allocation failure");
        return(*status = MEMORY_ALLOCATION);
      }
      
      (*exprs) = (char **) ptr;     /* Pointer array portion */
      ptr = (char *) (&((*exprs)[5])); /* String portion starts after the pointer array */
      for (ii = 0; ii <= 4; ii++) {
	(*exprs)[ii] = ptr;
	nchars = (exprend[ii]-exprbeg[ii]);
	strncpy(ptr, exprbeg[ii], nchars);
	ptr += nchars;
	ptr[0] = 0; /* Ensure null terminator */
	ptr ++; /* Advance to next string position */
      }
    }      
      
    return(*status);
}